

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * unpack2_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  *out = (*in & 3) + base;
  out[1] = (*in >> 2 & 3) + base;
  out[2] = (*in >> 4 & 3) + base;
  out[3] = (*in >> 6 & 3) + base;
  out[4] = (*in >> 8 & 3) + base;
  out[5] = (*in >> 10 & 3) + base;
  out[6] = (*in >> 0xc & 3) + base;
  out[7] = (*in >> 0xe & 3) + base;
  out[8] = (*(ushort *)((long)in + 2) & 3) + base;
  out[9] = (*in >> 0x12 & 3) + base;
  out[10] = (*in >> 0x14 & 3) + base;
  out[0xb] = (*in >> 0x16 & 3) + base;
  out[0xc] = (*(byte *)((long)in + 3) & 3) + base;
  out[0xd] = (*in >> 0x1a & 3) + base;
  out[0xe] = (*in >> 0x1c & 3) + base;
  out[0xf] = (*in >> 0x1e) + base;
  return in + 1;
}

Assistant:

uint32_t * unpack2_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}